

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakF-1600-opt64.c
# Opt level: O1

void KeccakExtract(uchar *state,uchar *data,uint laneCount)

{
  memcpy(data,state,(ulong)(laneCount * 8));
  if ((((1 < laneCount) && (*(ulong *)(data + 8) = ~*(ulong *)(data + 8), laneCount != 2)) &&
      (*(ulong *)(data + 0x10) = ~*(ulong *)(data + 0x10), 8 < laneCount)) &&
     (((*(ulong *)(data + 0x40) = ~*(ulong *)(data + 0x40), 0xc < laneCount &&
       (*(ulong *)(data + 0x60) = ~*(ulong *)(data + 0x60), 0x11 < laneCount)) &&
      (*(ulong *)(data + 0x88) = ~*(ulong *)(data + 0x88), 0x14 < laneCount)))) {
    *(ulong *)(data + 0xa0) = ~*(ulong *)(data + 0xa0);
  }
  return;
}

Assistant:

static void KeccakExtract(const unsigned char *state, unsigned char *data, unsigned int laneCount)
{
#if (PLATFORM_BYTE_ORDER == IS_LITTLE_ENDIAN)
    memcpy(data, state, laneCount*8);
#else
    unsigned int i;

    for(i=0; i<laneCount; i++)
        fromWordToBytes(data+(i*8), ((const UINT64*)state)[i]);
#endif
#ifdef UseBebigokimisa
    if (laneCount > 1) {
        ((UINT64*)data)[ 1] = ~((UINT64*)data)[ 1];
        if (laneCount > 2) {
            ((UINT64*)data)[ 2] = ~((UINT64*)data)[ 2];
            if (laneCount > 8) {
                ((UINT64*)data)[ 8] = ~((UINT64*)data)[ 8];
                if (laneCount > 12) {
                    ((UINT64*)data)[12] = ~((UINT64*)data)[12];
                    if (laneCount > 17) {
                        ((UINT64*)data)[17] = ~((UINT64*)data)[17];
                        if (laneCount > 20) {
                            ((UINT64*)data)[20] = ~((UINT64*)data)[20];
                        }
                    }
                }
            }
        }
    }
#endif
}